

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractDOMParser.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::AbstractDOMParser::entityDecl
          (AbstractDOMParser *this,DTDEntityDecl *entityDecl,bool param_2,bool param_3)

{
  XMLBuffer *pXVar1;
  XMLSize_t XVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long *plVar6;
  XMLCh *pXVar7;
  undefined7 in_register_00000009;
  undefined7 in_register_00000011;
  long *plVar5;
  
  iVar4 = (*(this->fDocument->super_DOMMemoryManager)._vptr_DOMMemoryManager[0x3a])
                    (this->fDocument,(entityDecl->super_XMLEntityDecl).fName,
                     CONCAT71(in_register_00000011,param_2),CONCAT71(in_register_00000009,param_3));
  plVar5 = (long *)CONCAT44(extraout_var,iVar4);
  (**(code **)(*plVar5 + 0x198))(plVar5,(entityDecl->super_XMLEntityDecl).fPublicId);
  (**(code **)(*plVar5 + 0x1a0))(plVar5,(entityDecl->super_XMLEntityDecl).fSystemId);
  (**(code **)(*plVar5 + 400))(plVar5,(entityDecl->super_XMLEntityDecl).fNotationName);
  (**(code **)(*plVar5 + 0x1b8))(plVar5,(entityDecl->super_XMLEntityDecl).fBaseURI);
  iVar4 = (*(this->fDocumentType->super_DOMDocumentType).super_DOMNode._vptr_DOMNode[0x29])();
  plVar6 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_00,iVar4) + 0x10))
                             ((long *)CONCAT44(extraout_var_00,iVar4),plVar5);
  if (plVar6 != (long *)0x0) {
    (**(code **)(*plVar6 + 0x138))(plVar6);
  }
  bVar3 = DOMDocumentTypeImpl::isIntSubsetReading(this->fDocumentType);
  if (bVar3) {
    pXVar1 = this->fInternalSubset;
    if (pXVar1->fIndex == pXVar1->fCapacity) {
      XMLBuffer::ensureCapacity(pXVar1,1);
    }
    XVar2 = pXVar1->fIndex;
    pXVar1->fIndex = XVar2 + 1;
    pXVar1->fBuffer[XVar2] = L'<';
    pXVar1 = this->fInternalSubset;
    if (pXVar1->fIndex == pXVar1->fCapacity) {
      XMLBuffer::ensureCapacity(pXVar1,1);
    }
    XVar2 = pXVar1->fIndex;
    pXVar1->fIndex = XVar2 + 1;
    pXVar1->fBuffer[XVar2] = L'!';
    XMLBuffer::append(this->fInternalSubset,L"ENTITY");
    pXVar1 = this->fInternalSubset;
    if (pXVar1->fIndex == pXVar1->fCapacity) {
      XMLBuffer::ensureCapacity(pXVar1,1);
    }
    XVar2 = pXVar1->fIndex;
    pXVar1->fIndex = XVar2 + 1;
    pXVar1->fBuffer[XVar2] = L' ';
    XMLBuffer::append(this->fInternalSubset,(entityDecl->super_XMLEntityDecl).fName);
    pXVar7 = (XMLCh *)(**(code **)(*plVar5 + 0x140))(plVar5);
    if (pXVar7 != (XMLCh *)0x0) {
      pXVar1 = this->fInternalSubset;
      if (pXVar1->fIndex == pXVar1->fCapacity) {
        XMLBuffer::ensureCapacity(pXVar1,1);
      }
      XVar2 = pXVar1->fIndex;
      pXVar1->fIndex = XVar2 + 1;
      pXVar1->fBuffer[XVar2] = L' ';
      XMLBuffer::append(this->fInternalSubset,(XMLCh *)XMLUni::fgPubIDString);
      pXVar1 = this->fInternalSubset;
      if (pXVar1->fIndex == pXVar1->fCapacity) {
        XMLBuffer::ensureCapacity(pXVar1,1);
      }
      XVar2 = pXVar1->fIndex;
      pXVar1->fIndex = XVar2 + 1;
      pXVar1->fBuffer[XVar2] = L' ';
      pXVar1 = this->fInternalSubset;
      if (pXVar1->fIndex == pXVar1->fCapacity) {
        XMLBuffer::ensureCapacity(pXVar1,1);
      }
      XVar2 = pXVar1->fIndex;
      pXVar1->fIndex = XVar2 + 1;
      pXVar1->fBuffer[XVar2] = L'\"';
      XMLBuffer::append(this->fInternalSubset,pXVar7);
      pXVar1 = this->fInternalSubset;
      if (pXVar1->fIndex == pXVar1->fCapacity) {
        XMLBuffer::ensureCapacity(pXVar1,1);
      }
      XVar2 = pXVar1->fIndex;
      pXVar1->fIndex = XVar2 + 1;
      pXVar1->fBuffer[XVar2] = L'\"';
    }
    pXVar7 = (XMLCh *)(**(code **)(*plVar5 + 0x148))(plVar5);
    if (pXVar7 != (XMLCh *)0x0) {
      pXVar1 = this->fInternalSubset;
      if (pXVar1->fIndex == pXVar1->fCapacity) {
        XMLBuffer::ensureCapacity(pXVar1,1);
      }
      XVar2 = pXVar1->fIndex;
      pXVar1->fIndex = XVar2 + 1;
      pXVar1->fBuffer[XVar2] = L' ';
      XMLBuffer::append(this->fInternalSubset,(XMLCh *)XMLUni::fgSysIDString);
      pXVar1 = this->fInternalSubset;
      if (pXVar1->fIndex == pXVar1->fCapacity) {
        XMLBuffer::ensureCapacity(pXVar1,1);
      }
      XVar2 = pXVar1->fIndex;
      pXVar1->fIndex = XVar2 + 1;
      pXVar1->fBuffer[XVar2] = L' ';
      pXVar1 = this->fInternalSubset;
      if (pXVar1->fIndex == pXVar1->fCapacity) {
        XMLBuffer::ensureCapacity(pXVar1,1);
      }
      XVar2 = pXVar1->fIndex;
      pXVar1->fIndex = XVar2 + 1;
      pXVar1->fBuffer[XVar2] = L'\"';
      XMLBuffer::append(this->fInternalSubset,pXVar7);
      pXVar1 = this->fInternalSubset;
      if (pXVar1->fIndex == pXVar1->fCapacity) {
        XMLBuffer::ensureCapacity(pXVar1,1);
      }
      XVar2 = pXVar1->fIndex;
      pXVar1->fIndex = XVar2 + 1;
      pXVar1->fBuffer[XVar2] = L'\"';
    }
    pXVar7 = (XMLCh *)(**(code **)(*plVar5 + 0x150))(plVar5);
    if (pXVar7 != (XMLCh *)0x0) {
      pXVar1 = this->fInternalSubset;
      if (pXVar1->fIndex == pXVar1->fCapacity) {
        XMLBuffer::ensureCapacity(pXVar1,1);
      }
      XVar2 = pXVar1->fIndex;
      pXVar1->fIndex = XVar2 + 1;
      pXVar1->fBuffer[XVar2] = L' ';
      XMLBuffer::append(this->fInternalSubset,(XMLCh *)XMLUni::fgNDATAString);
      pXVar1 = this->fInternalSubset;
      if (pXVar1->fIndex == pXVar1->fCapacity) {
        XMLBuffer::ensureCapacity(pXVar1,1);
      }
      XVar2 = pXVar1->fIndex;
      pXVar1->fIndex = XVar2 + 1;
      pXVar1->fBuffer[XVar2] = L' ';
      XMLBuffer::append(this->fInternalSubset,pXVar7);
    }
    pXVar7 = (entityDecl->super_XMLEntityDecl).fValue;
    if (pXVar7 != (XMLCh *)0x0) {
      pXVar1 = this->fInternalSubset;
      if (pXVar1->fIndex == pXVar1->fCapacity) {
        XMLBuffer::ensureCapacity(pXVar1,1);
      }
      XVar2 = pXVar1->fIndex;
      pXVar1->fIndex = XVar2 + 1;
      pXVar1->fBuffer[XVar2] = L' ';
      pXVar1 = this->fInternalSubset;
      if (pXVar1->fIndex == pXVar1->fCapacity) {
        XMLBuffer::ensureCapacity(pXVar1,1);
      }
      XVar2 = pXVar1->fIndex;
      pXVar1->fIndex = XVar2 + 1;
      pXVar1->fBuffer[XVar2] = L'\"';
      XMLBuffer::append(this->fInternalSubset,pXVar7);
      pXVar1 = this->fInternalSubset;
      if (pXVar1->fIndex == pXVar1->fCapacity) {
        XMLBuffer::ensureCapacity(pXVar1,1);
      }
      XVar2 = pXVar1->fIndex;
      pXVar1->fIndex = XVar2 + 1;
      pXVar1->fBuffer[XVar2] = L'\"';
    }
    pXVar1 = this->fInternalSubset;
    if (pXVar1->fIndex == pXVar1->fCapacity) {
      XMLBuffer::ensureCapacity(pXVar1,1);
    }
    XVar2 = pXVar1->fIndex;
    pXVar1->fIndex = XVar2 + 1;
    pXVar1->fBuffer[XVar2] = L'>';
  }
  return;
}

Assistant:

void AbstractDOMParser::entityDecl
(
    const   DTDEntityDecl&  entityDecl
    , const bool
    , const bool
)
{
    DOMEntityImpl* entity = (DOMEntityImpl *) fDocument->createEntity(entityDecl.getName());

    entity->setPublicId(entityDecl.getPublicId());
    entity->setSystemId(entityDecl.getSystemId());
    entity->setNotationName(entityDecl.getNotationName());
    entity->setBaseURI(entityDecl.getBaseURI());

    DOMEntityImpl *previousDef = (DOMEntityImpl *)
	    fDocumentType->getEntities()->setNamedItem( entity );

    if (previousDef)
        previousDef->release();

    if (fDocumentType->isIntSubsetReading())
    {
        //add thes chars to internalSubset variable
        fInternalSubset.append(chOpenAngle);
        fInternalSubset.append(chBang);
        fInternalSubset.append(XMLUni::fgEntityString);
        fInternalSubset.append(chSpace);

        fInternalSubset.append(entityDecl.getName());

        const XMLCh* id = entity->getPublicId();
        if (id != 0) {
            fInternalSubset.append(chSpace);
            fInternalSubset.append(XMLUni::fgPubIDString);
            fInternalSubset.append(chSpace);
            fInternalSubset.append(chDoubleQuote);
            fInternalSubset.append(id);
            fInternalSubset.append(chDoubleQuote);
        }
        id = entity->getSystemId();
        if (id != 0) {
            fInternalSubset.append(chSpace);
            fInternalSubset.append(XMLUni::fgSysIDString);
            fInternalSubset.append(chSpace);
            fInternalSubset.append(chDoubleQuote);
            fInternalSubset.append(id);
            fInternalSubset.append(chDoubleQuote);

        }
        id = entity->getNotationName();
        if (id != 0) {
            fInternalSubset.append(chSpace);
            fInternalSubset.append(XMLUni::fgNDATAString);
            fInternalSubset.append(chSpace);
            fInternalSubset.append(id);
        }
        id = entityDecl.getValue();
        if (id !=0) {
            fInternalSubset.append(chSpace);
            fInternalSubset.append(chDoubleQuote);
            fInternalSubset.append(id);
            fInternalSubset.append(chDoubleQuote);
        }

        fInternalSubset.append(chCloseAngle);
    }

}